

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O3

void __thiscall jpgd::jpeg_decoder::process_restart(jpeg_decoder *this)

{
  int iVar1;
  uint8 uVar2;
  byte bVar3;
  uint8 *puVar4;
  byte *pbVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  
  iVar6 = this->m_in_buf_left;
  uVar8 = 0x601;
  do {
    if (iVar6 == 0) {
      prep_in_buffer(this);
      iVar6 = this->m_in_buf_left;
      if (iVar6 != 0) goto LAB_00120e03;
      uVar7 = this->m_tem_flag;
      this->m_tem_flag = uVar7 ^ 1;
      iVar6 = 0;
      if (uVar7 == 0) goto LAB_00120e49;
    }
    else {
LAB_00120e03:
      puVar4 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = puVar4 + 1;
      uVar2 = *puVar4;
      iVar6 = iVar6 + -1;
      this->m_in_buf_left = iVar6;
      if (uVar2 == 0xff) {
LAB_00120e49:
        iVar1 = uVar8 - 1;
        if (0 < iVar1) goto LAB_00120e51;
        uVar7 = 0;
        goto LAB_00120ec2;
      }
    }
    uVar8 = uVar8 - 1;
  } while (1 < uVar8);
  goto LAB_00120f39;
LAB_00120e51:
  do {
    if (iVar6 == 0) {
      prep_in_buffer(this);
      iVar6 = this->m_in_buf_left;
      if (iVar6 != 0) goto LAB_00120e67;
      uVar7 = this->m_tem_flag;
      this->m_tem_flag = uVar7 ^ 1;
      iVar6 = 0;
      if (uVar7 != 0) {
        uVar7 = 0xd9;
        goto LAB_00120ec2;
      }
    }
    else {
LAB_00120e67:
      pbVar5 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = pbVar5 + 1;
      bVar3 = *pbVar5;
      uVar7 = (uint)bVar3;
      iVar6 = iVar6 + -1;
      this->m_in_buf_left = iVar6;
      if (bVar3 != 0xff) goto LAB_00120ec2;
    }
    uVar8 = uVar8 - 1;
  } while (1 < (int)uVar8);
  uVar7 = 0xff;
  if (iVar1 < 1) {
LAB_00120ec2:
    iVar6 = this->m_next_restart_num;
    if (uVar7 == iVar6 + 0xd0U) {
      memset(this->m_last_dc_val,0,(long)this->m_comps_in_frame << 2);
      this->m_eob_run = 0;
      this->m_restarts_left = this->m_restart_interval;
      this->m_next_restart_num = iVar6 + 1U & 7;
      this->m_bits_left = 0x10;
      get_bits_no_markers(this,0x10);
      get_bits_no_markers(this,0x10);
      return;
    }
  }
LAB_00120f39:
  stop_decoding(this,JPGD_BAD_RESTART_MARKER);
}

Assistant:

void jpeg_decoder::process_restart() {
  int i;
  int c = 0;

  // Align to a byte boundry
  // FIXME: Is this really necessary? get_bits_no_markers() never reads in markers!
  //get_bits_no_markers(m_bits_left & 7);

  // Let's scan a little bit to find the marker, but not _too_ far.
  // 1536 is a "fudge factor" that determines how much to scan.
  for (i = 1536; i > 0; i--)
    if (get_char() == 0xFF)
      break;

  if (i == 0)
    stop_decoding(JPGD_BAD_RESTART_MARKER);

  for (; i > 0; i--)
    if ((c = get_char()) != 0xFF)
      break;

  if (i == 0)
    stop_decoding(JPGD_BAD_RESTART_MARKER);

  // Is it the expected marker? If not, something bad happened.
  if (c != (m_next_restart_num + M_RST0))
    stop_decoding(JPGD_BAD_RESTART_MARKER);

  // Reset each component's DC prediction values.
  memset(&m_last_dc_val, 0, m_comps_in_frame * sizeof(uint));

  m_eob_run = 0;

  m_restarts_left = m_restart_interval;

  m_next_restart_num = (m_next_restart_num + 1) & 7;

  // Get the bit buffer going again...

  m_bits_left = 16;
  get_bits_no_markers(16);
  get_bits_no_markers(16);
}